

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

int AF_A_ClearOverlays(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  int iVar2;
  undefined8 *puVar3;
  long lVar4;
  DPSprite *pDVar5;
  PClass *pPVar6;
  PClass *pPVar7;
  DPSprite *this;
  int iVar8;
  int iVar9;
  int iVar10;
  char *__assertion;
  int iVar11;
  undefined8 *puVar12;
  anon_union_8_2_947301c2_for_TObjPtr<DPSprite>_1 *paVar13;
  bool bVar14;
  
  pPVar6 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0055acb4;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_0055aca4;
  puVar12 = (undefined8 *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (puVar12 == (undefined8 *)0x0) goto LAB_0055a9e4;
    pPVar7 = (PClass *)puVar12[1];
    if (pPVar7 == (PClass *)0x0) {
      pPVar7 = (PClass *)(**(code **)*puVar12)(puVar12);
      puVar12[1] = pPVar7;
    }
    bVar14 = pPVar7 != (PClass *)0x0;
    if (pPVar7 != pPVar6 && bVar14) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar14 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar6) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (!bVar14) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0055acb4;
    }
  }
  else {
    if (puVar12 != (undefined8 *)0x0) goto LAB_0055aca4;
LAB_0055a9e4:
    puVar12 = (undefined8 *)0x0;
  }
  pPVar6 = AActor::RegistrationInfo.MyClass;
  iVar8 = 0;
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_0055aca4:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_0055acb4;
      }
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar3 != (undefined8 *)0x0) {
          pPVar7 = (PClass *)puVar3[1];
          if (pPVar7 == (PClass *)0x0) {
            pPVar7 = (PClass *)(**(code **)*puVar3)(puVar3);
            puVar3[1] = pPVar7;
          }
          bVar14 = pPVar7 != (PClass *)0x0;
          if (pPVar7 != pPVar6 && bVar14) {
            do {
              pPVar7 = pPVar7->ParentClass;
              bVar14 = pPVar7 != (PClass *)0x0;
              if (pPVar7 == pPVar6) break;
            } while (pPVar7 != (PClass *)0x0);
          }
          if (!bVar14) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_0055acb4;
          }
        }
      }
      else if (puVar3 != (undefined8 *)0x0) goto LAB_0055aca4;
    }
    bVar14 = true;
    if (2 < numparam) {
      VVar1 = param[2].field_0.field_3.Type;
      if ((VVar1 != 0xff) &&
         ((VVar1 != '\x03' ||
          ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
        ;
LAB_0055acb4:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                      ,0x48f,
                      "int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      if (numparam != 3) {
        VVar1 = param[3].field_0.field_3.Type;
        if (VVar1 == '\0') {
          iVar11 = param[3].field_0.i;
        }
        else {
          iVar11 = 0;
          if (VVar1 != 0xff) {
            __assert_fail("param[paramnum].Type == REGT_INT",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                          ,0x490,
                          "int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)")
            ;
          }
        }
        iVar8 = 0;
        if (4 < (uint)numparam) {
          VVar1 = param[4].field_0.field_3.Type;
          if (VVar1 == '\0') {
            iVar8 = param[4].field_0.i;
          }
          else {
            iVar8 = 0;
            if (VVar1 != 0xff) {
              __assert_fail("param[paramnum].Type == REGT_INT",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                            ,0x491,
                            "int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                           );
            }
          }
          if (numparam != 5) {
            VVar1 = param[5].field_0.field_3.Type;
            if (VVar1 == '\0') {
              bVar14 = param[5].field_0.i != 0;
            }
            else if (VVar1 != 0xff) {
              __assert_fail("param[paramnum].Type == REGT_INT",
                            "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                            ,0x492,
                            "int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                           );
            }
          }
        }
        goto LAB_0055aace;
      }
    }
  }
  bVar14 = true;
  iVar11 = 0;
LAB_0055aace:
  lVar4 = puVar12[0x40];
  if (lVar4 == 0) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x495,"int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    iVar9 = 0;
  }
  else {
    iVar10 = (uint)(bVar14 ^ 1) * 3 + 0x7ffffffc;
    if (iVar11 != 0 || iVar8 != 0) {
      iVar10 = iVar8;
    }
    pDVar5 = *(DPSprite **)(lVar4 + 0xe0);
    iVar9 = 0;
    if (pDVar5 != (DPSprite *)0x0) {
      if (((pDVar5->super_DObject).ObjectFlags & 0x20) == 0) {
        iVar9 = 0;
        do {
          this = pDVar5;
          iVar2 = this->ID;
          if ((iVar2 != 0) && (iVar11 <= iVar2 || iVar11 == 0 && iVar8 == 0)) {
            if (iVar10 < iVar2) goto LAB_0055aba1;
            if (bVar14 != false) {
              if (0x7ffffffc < iVar2) goto LAB_0055aba1;
              if (((iVar2 == -1) || (iVar2 == 1)) || (iVar2 == 1000)) goto LAB_0055ab66;
            }
            DPSprite::SetState(this,(FState *)0x0,false);
            iVar9 = iVar9 + 1;
          }
LAB_0055ab66:
          pDVar5 = (this->Next).field_0.p;
          if (pDVar5 == (DPSprite *)0x0) goto LAB_0055aba1;
        } while (((pDVar5->super_DObject).ObjectFlags & 0x20) == 0);
        paVar13 = &(this->Next).field_0;
      }
      else {
        paVar13 = (anon_union_8_2_947301c2_for_TObjPtr<DPSprite>_1 *)(lVar4 + 0xe0);
      }
      paVar13->p = (DPSprite *)0x0;
    }
LAB_0055aba1:
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_pspr.cpp"
                    ,0x4b5,"int AF_A_ClearOverlays(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
  }
  if (ret->RegType == '\0') {
    *(int *)ret->Location = iVar9;
    return 1;
  }
  __assert_fail("RegType == REGT_INT",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/vm.h"
                ,0x118,"void VMReturn::SetInt(int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_ClearOverlays)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_INT_OPT(start) { start = 0; }
	PARAM_INT_OPT(stop) { stop = 0; }
	PARAM_BOOL_OPT(safety) { safety = true; }

	if (self->player == nullptr)
		ACTION_RETURN_INT(0);

	if (!start && !stop)
	{
		start = INT_MIN;
		stop = safety ? PSP_TARGETCENTER - 1 : INT_MAX;
	}

	unsigned int count = 0;
	int id;

	for (DPSprite *pspr = self->player->psprites; pspr != nullptr; pspr = pspr->GetNext())
	{
		id = pspr->GetID();

		if (id < start || id == 0)
			continue;
		else if (id > stop)
			break;

		if (safety)
		{
			if (id >= PSP_TARGETCENTER)
				break;
			else if (id == PSP_STRIFEHANDS || id == PSP_WEAPON || id == PSP_FLASH)
				continue;
		}

		pspr->SetState(nullptr);
		count++;
	}

	ACTION_RETURN_INT(count);
}